

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O3

bool Assimp::Blender::read<Assimp::Blender::MPoly>
               (Structure *s,MPoly *p,size_t cnt,FileDatabase *db)

{
  int *piVar1;
  MPoly read;
  MPoly local_50;
  
  if (cnt != 0) {
    piVar1 = &p->loopstart;
    do {
      local_50.super_ElemBase.dna_type = (char *)0x0;
      local_50.super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_007e0e88;
      Structure::Convert<Assimp::Blender::MPoly>(s,&local_50,db);
      *(char **)(piVar1 + -2) = local_50.super_ElemBase.dna_type;
      *(ulong *)piVar1 = CONCAT17(local_50.totloop._3_1_,local_50._16_7_);
      *(undefined4 *)((long)piVar1 + 7) = local_50._23_4_;
      piVar1 = piVar1 + 8;
      cnt = cnt - 1;
    } while (cnt != 0);
  }
  return true;
}

Assistant:

bool read(const Structure &s, T *p, const size_t cnt, const FileDatabase &db) {
            for (size_t i = 0; i < cnt; ++i) {
                T read;
                s.Convert(read, db);
                *p = read;
                p++;
            }
            return true;
        }